

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

int xp_compute(CHAR_DATA *gch,CHAR_DATA *victim,int group_amount,int glevel)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  int in_ECX;
  CHAR_DATA *ch;
  int in_EDX;
  long in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *cPeers;
  float gavg;
  float peer_factor;
  float mult;
  int level_range;
  float base_exp;
  float xp;
  int in_stack_ffffffffffffffa0;
  float local_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  CHAR_DATA *local_38;
  float local_30;
  float local_2c;
  float local_28;
  int local_24;
  float local_20;
  float local_1c;
  int local_14;
  long local_10;
  CHAR_DATA *local_8;
  
  local_2c = 1.75;
  local_30 = (float)(in_ECX / in_EDX);
  local_38 = (CHAR_DATA *)0x0;
  if (local_30 <= (float)(int)in_RDI->level) {
    local_5c = (float)(int)in_RDI->level - local_30;
  }
  else {
    local_5c = local_30 - (float)(int)in_RDI->level;
  }
  local_28 = (local_5c * -6.0 + 100.0) / 100.0;
  local_24 = (int)*(short *)(in_RSI + 0x138) - (int)in_RDI->level;
  ch = (CHAR_DATA *)(ulong)(local_24 + 9);
  switch(ch) {
  case (CHAR_DATA *)0x0:
    local_20 = 2.0;
    break;
  case (CHAR_DATA *)0x1:
    local_20 = 4.0;
    break;
  case (CHAR_DATA *)0x2:
    local_20 = 7.0;
    break;
  case (CHAR_DATA *)0x3:
    local_20 = 12.0;
    break;
  case (CHAR_DATA *)0x4:
    local_20 = 14.0;
    break;
  case (CHAR_DATA *)0x5:
    local_20 = 25.0;
    break;
  case (CHAR_DATA *)0x6:
    local_20 = 36.0;
    break;
  case (CHAR_DATA *)0x7:
    local_20 = 55.0;
    break;
  case (CHAR_DATA *)0x8:
    local_20 = 85.0;
    break;
  case (CHAR_DATA *)0x9:
    local_20 = 100.0;
    break;
  case (CHAR_DATA *)0xa:
    local_20 = 150.0;
    break;
  case (CHAR_DATA *)0xb:
    local_20 = 200.0;
    break;
  case (CHAR_DATA *)0xc:
    local_20 = 250.0;
    break;
  case (CHAR_DATA *)0xd:
    local_20 = 300.0;
    break;
  default:
    local_20 = 0.0;
  }
  if (4 < local_24) {
    local_20 = (float)(local_24 * 0x14 + 200);
  }
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = is_good(ch);
  if (bVar1) {
    bVar1 = is_evil(ch);
    if (bVar1) {
      local_1c = (local_20 * 4.0) / 3.0;
    }
    else {
      bVar1 = is_good(ch);
      if (bVar1) {
        local_1c = 0.0;
      }
      else {
        local_1c = local_20;
      }
    }
  }
  else {
    bVar1 = is_evil(ch);
    if (bVar1) {
      bVar1 = is_good(ch);
      if (bVar1) {
        local_1c = (local_20 * 4.0) / 3.0;
      }
      else {
        bVar1 = is_evil(ch);
        if (bVar1) {
          local_1c = local_20 / 2.0;
        }
        else {
          local_1c = local_20;
        }
      }
    }
    else {
      local_1c = local_20;
    }
  }
  iVar2 = number_range(in_stack_ffffffffffffffa0,(int)((ulong)ch >> 0x20));
  local_1c = local_28 * (float)iVar2;
  bVar1 = is_npc(ch);
  if ((bVar1) && ((*(byte *)(local_10 + 0x334) & 1) != 0)) {
    local_1c = local_1c * 0.55;
  }
  local_1c = (local_1c * 12.0) / 10.0;
  if (3 < local_14) {
    local_1c = local_1c / (float)(local_14 + -2);
  }
  bVar1 = is_npc(ch);
  if (!bVar1) {
    for (local_38 = char_list; local_38 != (CHAR_DATA *)0x0; local_38 = local_38->next) {
      bVar1 = is_npc(ch);
      if ((((!bVar1) && (local_38 != local_8)) && (local_8->level + -8 < (int)local_38->level)) &&
         ((int)local_38->level < local_8->level + 8)) {
        local_40 = 1.0;
        local_48 = (double)local_2c - 0.25;
        pdVar3 = std::max<double>(&local_40,&local_48);
        local_2c = (float)*pdVar3;
      }
    }
  }
  if (local_14 == 2) {
    local_50 = 1.0;
    local_58 = (double)local_2c * 0.66;
    pdVar3 = std::max<double>(&local_50,&local_58);
    local_2c = (float)*pdVar3;
  }
  if (local_14 == 3) {
    local_2c = 1.0;
  }
  return (int)(local_2c * local_1c);
}

Assistant:

int xp_compute(CHAR_DATA *gch, CHAR_DATA *victim, int group_amount, int glevel)
{
	float xp, base_exp;
	int level_range;
	float mult, peer_factor = BASE_PEER_FACTOR, gavg = glevel / group_amount;
	CHAR_DATA *cPeers = nullptr;
	mult = (100 - (gavg > gch->level ? gavg - gch->level : gch->level - gavg) * 6) / 100;
	level_range = victim->level - gch->level;

	/* compute the base exp */
	switch (level_range)
	{
		case -9:
			base_exp = 2;
			break;
		case -8:
			base_exp = 4;
			break;
		case -7:
			base_exp = 7;
			break;
		case -6:
			base_exp = 12;
			break;
		case -5:
			base_exp = 14;
			break;
		case -4:
			base_exp = 25;
			break;
		case -3:
			base_exp = 36;
			break;
		case -2:
			base_exp = 55;
			break;
		case -1:
			base_exp = 85;
			break;
		case 0:
			base_exp = 100;
			break;
		case 1:
			base_exp = 150;
			break;
		case 2:
			base_exp = 200;
			break;
		case 3:
			base_exp = 250;
			break;
		case 4:
			base_exp = 300;
			break;
		default:
			base_exp = 0;
			break;
	}

	if (level_range > 4)
		base_exp = 200 + 20 * level_range;

	if (is_good(gch))
	{
		if (is_evil(victim))
			xp = (base_exp * 4) / 3;
		else if (is_good(victim))
			xp = 0;
		else
			xp = base_exp;
	}
	else if (is_evil(gch))
	{
		if (is_good(victim))
			xp = (base_exp * 4) / 3;
		else if (is_evil(victim))
			xp = base_exp / 2;
		else
			xp = base_exp;
	}
	else /* neutral */
	{
		xp = base_exp;
	}

	xp = number_range((int)(xp * 3 / 4), (int)(xp * 5 / 4));
	xp *= mult;

	//    if(is_npc(victim))
	//	xp *= (float)victim->pIndexData->xp_mod / (float)100;
	if (is_npc(victim) && victim->law_pass)
		xp *= SUMMONED_XP_PENALTY;
	/* adjust for grouping */

	// if (group_amount == 2)
	//    xp = (xp * 4)/3;
	// if (group_amount == 3)
	//
	xp = (xp * 12) / 10;

	if (group_amount > 3)
		xp /= (group_amount - 2);

	if (!is_npc(gch))
	{
		for (cPeers = char_list; cPeers; cPeers = cPeers->next)
		{
			if (!is_npc(cPeers)
				&& cPeers != gch
				&& cPeers->level > gch->level - PEER_BALANCE_DISTANCE
				&& cPeers->level < gch->level + PEER_BALANCE_DISTANCE)
			{
				peer_factor = std::max((double)1, peer_factor - 0.25);
			}
		}
	}

	if (group_amount == 2)
		peer_factor = std::max((double)1, peer_factor * 0.66);

	if (group_amount == 3)
		peer_factor = 1;

	xp *= peer_factor;
	/*
	sprintf(buf,"(WIZ_LOGGING) %s gains experience in a group of %d: peer modifier is %f%%.", gch->name,group_amount,peer_factor*100);
	wiznet(buf,nullptr,nullptr,WIZ_LOG,0,0);
	*/

	return (int)xp;
}